

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  Select *pSVar6;
  sqlite3 *db;
  Window *pWVar7;
  ExprList *pEVar8;
  bool bVar9;
  Expr *pEVar10;
  Expr *pEVar11;
  CollSeq *pCVar12;
  CollSeq *pCVar13;
  u8 uVar14;
  uint joinFlag;
  Select *pSVar15;
  char *zC;
  ExprList **ppEVar16;
  ExprList_item *pEVar17;
  long lVar18;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
    pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
  }
  if (pExpr->op == 0xb3) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_0019be84:
    pEVar10 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar10;
    pEVar10 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar10;
    pSVar6 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x1000) == 0) {
      if ((pSVar6 != (Select *)0x0) &&
         (iVar4._0_1_ = pSVar6->op, iVar4._1_1_ = pSVar6->field_0x1,
         iVar4._2_2_ = pSVar6->nSelectRow, 0 < iVar4)) {
        ppEVar16 = (ExprList **)&pSVar6->iLimit;
        lVar18 = 0;
        do {
          pEVar10 = substExpr(pSubst,(Expr *)*ppEVar16);
          *ppEVar16 = (ExprList *)pEVar10;
          lVar18 = lVar18 + 1;
          iVar5._0_1_ = pSVar6->op;
          iVar5._1_1_ = pSVar6->field_0x1;
          iVar5._2_2_ = pSVar6->nSelectRow;
          ppEVar16 = ppEVar16 + 3;
        } while (lVar18 < iVar5);
      }
    }
    else {
      substSelect(pSubst,pSVar6,1);
    }
    if ((pExpr->flags & 0x1000000) != 0) {
      pWVar7 = (pExpr->y).pWin;
      pEVar10 = substExpr(pSubst,pWVar7->pFilter);
      pWVar7->pFilter = pEVar10;
      pEVar8 = pWVar7->pPartition;
      if ((pEVar8 != (ExprList *)0x0) && (0 < pEVar8->nExpr)) {
        pEVar17 = pEVar8->a;
        lVar18 = 0;
        do {
          pEVar10 = substExpr(pSubst,pEVar17->pExpr);
          pEVar17->pExpr = pEVar10;
          lVar18 = lVar18 + 1;
          pEVar17 = pEVar17 + 1;
        } while (lVar18 < pEVar8->nExpr);
      }
      pEVar8 = pWVar7->pOrderBy;
      if ((pEVar8 != (ExprList *)0x0) && (0 < pEVar8->nExpr)) {
        pEVar17 = pEVar8->a;
        lVar18 = 0;
        do {
          pEVar10 = substExpr(pSubst,pEVar17->pExpr);
          pEVar17->pExpr = pEVar10;
          lVar18 = lVar18 + 1;
          pEVar17 = pEVar17 + 1;
        } while (lVar18 < pEVar8->nExpr);
      }
    }
    return pExpr;
  }
  if (((pExpr->op != 0xa7) || ((pExpr->flags & 0x20) != 0)) || (pExpr->iTable != pSubst->iTable))
  goto LAB_0019be84;
  sVar3 = pExpr->iColumn;
  pSVar6 = (Select *)pSubst->pEList->a[sVar3].pExpr;
  uVar2 = pSVar6->op;
  uVar14 = uVar2;
  if (uVar2 == 0xb0) {
    uVar14 = *(u8 *)&pSVar6->nSelectRow;
  }
  pSVar15 = pSVar6;
  if (uVar14 != 0xb1) {
    bVar9 = true;
    if (uVar14 != 0x8a) goto LAB_0019bde1;
    pSVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar6->pEList)->pSelect;
  }
  bVar9 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr < 2;
LAB_0019bde1:
  if (!bVar9) {
    sqlite3VectorErrorMsg(pSubst->pParse,(Expr *)pSVar6);
    return pExpr;
  }
  db = pSubst->pParse->db;
  pSVar15 = pSVar6;
  if ((uVar2 != 0xa7) && (pSubst->isOuterJoin != 0)) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.pAggInfo = (AggInfo *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78.y.pTab = (Table *)0x0;
    local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
    local_78.iColumn = -99;
    local_78.iAgg = 0;
    local_78.w = (anon_union_4_2_009eaf8f_for_w)0x0;
    local_78.op = 0xb3;
    local_78.affExpr = '\0';
    local_78.op2 = '\0';
    local_78._3_1_ = 0;
    local_78.flags = 0x40000;
    pSVar15 = (Select *)&local_78;
    local_78.pLeft = (Expr *)pSVar6;
  }
  pEVar10 = exprDup(db,(Expr *)pSVar15,0,(u8 **)0x0);
  if (db->mallocFailed != '\0') {
    if (pEVar10 == (Expr *)0x0) {
      return pExpr;
    }
    sqlite3ExprDeleteNN(db,pEVar10);
    return pExpr;
  }
  if (pSubst->isOuterJoin != 0) {
    pbVar1 = (byte *)((long)&pEVar10->flags + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  joinFlag = pExpr->flags & 3;
  if (joinFlag != 0) {
    sqlite3SetJoinExpr(pEVar10,(pExpr->w).iJoin,joinFlag);
  }
  sqlite3ExprDeleteNN(db,pExpr);
  pEVar11 = pEVar10;
  if (pEVar10->op == 0xaa) {
    do {
      if ((pEVar11->flags & 0x2000) == 0) break;
      pEVar11 = pEVar11->pLeft;
    } while (pEVar11 != (Expr *)0x0);
    *(uint *)&pEVar10->u = (uint)((pEVar11->u).zToken[4] == '\0');
    pEVar10->op = 0x9b;
    pbVar1 = (byte *)((long)&pEVar10->flags + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  pCVar12 = sqlite3ExprCollSeq(pSubst->pParse,pEVar10);
  pCVar13 = sqlite3ExprCollSeq(pSubst->pParse,pSubst->pCList->a[sVar3].pExpr);
  if ((pCVar12 != pCVar13) || ((pEVar10->op != 'q' && (pEVar10->op != 0xa7)))) {
    if (pCVar13 == (CollSeq *)0x0) {
      zC = "BINARY";
    }
    else {
      zC = pCVar13->zName;
    }
    pEVar10 = sqlite3ExprAddCollateString(pSubst->pParse,pEVar10,zC);
  }
  pbVar1 = (byte *)((long)&pEVar10->flags + 1);
  *pbVar1 = *pbVar1 & 0xfd;
  return pEVar10;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn = pExpr->iColumn;
      Expr *pCopy = pSubst->pEList->a[iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
        if( pExpr->op==TK_TRUEFALSE ){
          pExpr->u.iValue = sqlite3ExprTruthValue(pExpr);
          pExpr->op = TK_INTEGER;
          ExprSetProperty(pExpr, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pExpr);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pExpr->op!=TK_COLUMN && pExpr->op!=TK_COLLATE) ){
            pExpr = sqlite3ExprAddCollateString(pSubst->pParse, pExpr,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pExpr, EP_Collate);
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}